

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

String * __thiscall
kj::HttpHeaders::serialize
          (String *__return_storage_ptr__,HttpHeaders *this,ArrayPtr<const_char> word1,
          ArrayPtr<const_char> word2,ArrayPtr<const_char> word3,
          ArrayPtr<const_kj::StringPtr> connectionHeaders)

{
  size_t *rest;
  ulong uVar1;
  HttpHeaderTable *pHVar2;
  Range<unsigned_long> *target;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  unsigned_long *puVar7;
  Header *pHVar8;
  Range<unsigned_long> RVar9;
  ArrayPtr<const_char> AVar10;
  HttpHeaderId id;
  HttpHeaderId id_00;
  StringPtr *local_2d8;
  StringPtr *local_260;
  Fault local_218;
  Fault f_1;
  char **local_208;
  undefined1 local_200 [8];
  DebugComparison<char_*&,_char_*> _kjCondition_1;
  Header *header_1;
  Header *__end1_3;
  Header *__begin1_3;
  Vector<kj::HttpHeaders::Header> *__range1_3;
  undefined4 local_1b0;
  ArrayPtr<const_char> local_1a8;
  undefined1 auStack_198 [8];
  StringPtr value_1;
  unsigned_long i_1;
  Iterator __end1_2;
  Iterator __begin1_2;
  Range<unsigned_long> *__range1_2;
  char *ptr;
  Header *local_148;
  Header *header;
  Header *__end1_1;
  Header *__begin1_1;
  Vector<kj::HttpHeaders::Header> *__range1_1;
  undefined4 local_120;
  ArrayPtr<const_char> local_118;
  undefined1 local_108 [8];
  StringPtr value;
  unsigned_long i;
  Iterator __end1;
  Iterator __begin1;
  Range<unsigned_long> *__range1;
  Fault local_b8;
  Fault f;
  size_t local_a8;
  DebugExpression<unsigned_long> local_a0;
  undefined1 local_98 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  size_t size;
  StringPtr colon;
  StringPtr newline;
  StringPtr space;
  HttpHeaders *this_local;
  ArrayPtr<const_char> word2_local;
  ArrayPtr<const_char> word1_local;
  String *result;
  
  word2_local.ptr = (char *)word2.size_;
  this_local = (HttpHeaders *)word2.ptr;
  word2_local.size_ = (size_t)word1.ptr;
  StringPtr::StringPtr((StringPtr *)&newline.content.size_," ");
  StringPtr::StringPtr((StringPtr *)&colon.content.size_,"\r\n");
  StringPtr::StringPtr((StringPtr *)&size,": ");
  _kjCondition.result = true;
  _kjCondition._33_7_ = 0;
  bVar3 = ArrayPtr<const_char>::operator==((ArrayPtr<const_char> *)&word2_local.size_,(void *)0x0);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    sVar5 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&word2_local.size_);
    sVar6 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&this_local);
    sVar4 = ArrayPtr<const_char>::size(&word3);
    _kjCondition._32_8_ = sVar5 + sVar6 + sVar4 + 4 + _kjCondition._32_8_;
  }
  local_a8 = ArrayPtr<const_kj::StringPtr>::size(&connectionHeaders);
  local_a0 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_a8);
  f.exception = (Exception *)Array<kj::StringPtr>::size(&this->indexedHeaders);
  kj::_::DebugExpression<unsigned_long>::operator<=
            ((DebugComparison<unsigned_long,_unsigned_long> *)local_98,&local_a0,(unsigned_long *)&f
            );
  bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
  if (!bVar3) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&>
              (&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x441,FAILED,"connectionHeaders.size() <= indexedHeaders.size()","_kjCondition,",
               (DebugComparison<unsigned_long,_unsigned_long> *)local_98);
    kj::_::Debug::Fault::fatal(&local_b8);
  }
  ___begin1 = indices<kj::Array<kj::StringPtr>const&>(&this->indexedHeaders);
  __end1 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1);
  i = (unsigned_long)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1);
  while (bVar3 = Range<unsigned_long>::Iterator::operator==(&__end1,(Iterator *)&i),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    puVar7 = Range<unsigned_long>::Iterator::operator*(&__end1);
    uVar1 = *puVar7;
    value.content.size_ = uVar1;
    sVar5 = ArrayPtr<const_kj::StringPtr>::size(&connectionHeaders);
    if (uVar1 < sVar5) {
      local_260 = ArrayPtr<const_kj::StringPtr>::operator[](&connectionHeaders,value.content.size_);
    }
    else {
      local_260 = Array<kj::StringPtr>::operator[](&this->indexedHeaders,value.content.size_);
    }
    local_108 = (undefined1  [8])(local_260->content).ptr;
    value.content.ptr = (char *)(local_260->content).size_;
    bVar3 = StringPtr::operator==((StringPtr *)local_108,(void *)0x0);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      pHVar2 = this->table;
      HttpHeaderId::HttpHeaderId((HttpHeaderId *)&__range1_1,this->table,(uint)value.content.size_);
      id._12_4_ = 0;
      id.table = (HttpHeaderTable *)__range1_1;
      id.id = local_120;
      local_118 = (ArrayPtr<const_char>)HttpHeaderTable::idToString(pHVar2,id);
      sVar5 = StringPtr::size((StringPtr *)&local_118);
      sVar6 = StringPtr::size((StringPtr *)local_108);
      _kjCondition._32_8_ = sVar5 + sVar6 + 4 + _kjCondition._32_8_;
    }
    Range<unsigned_long>::Iterator::operator++(&__end1);
  }
  __begin1_1 = (Header *)&this->unindexedHeaders;
  __end1_1 = Vector<kj::HttpHeaders::Header>::begin((Vector<kj::HttpHeaders::Header> *)__begin1_1);
  header = Vector<kj::HttpHeaders::Header>::end((Vector<kj::HttpHeaders::Header> *)__begin1_1);
  for (; __end1_1 != header; __end1_1 = __end1_1 + 1) {
    local_148 = __end1_1;
    sVar5 = StringPtr::size(&__end1_1->name);
    sVar6 = StringPtr::size(&local_148->value);
    _kjCondition._32_8_ = sVar5 + sVar6 + 4 + _kjCondition._32_8_;
  }
  ptr._7_1_ = 0;
  heapString(__return_storage_ptr__,_kjCondition._32_8_);
  __range1_2 = (Range<unsigned_long> *)String::begin(__return_storage_ptr__);
  bVar3 = ArrayPtr<const_char>::operator==((ArrayPtr<const_char> *)&word2_local.size_,(void *)0x0);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    rest = &newline.content.size_;
    __range1_2 = (Range<unsigned_long> *)
                 kj::_::
                 fill<kj::ArrayPtr<char_const>,kj::StringPtr_const&,kj::ArrayPtr<char_const>&,kj::StringPtr_const&,kj::ArrayPtr<char_const>&,kj::StringPtr_const&>
                           ((char *)__range1_2,(ArrayPtr<const_char> *)&word2_local.size_,
                            (StringPtr *)rest,(ArrayPtr<const_char> *)&this_local,(StringPtr *)rest,
                            &word3,(StringPtr *)&colon.content.size_);
  }
  RVar9 = indices<kj::Array<kj::StringPtr>const&>(&this->indexedHeaders);
  __begin1_2.value = RVar9.begin_;
  __end1_2 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1_2);
  i_1 = (unsigned_long)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1_2);
  while( true ) {
    bVar3 = Range<unsigned_long>::Iterator::operator==(&__end1_2,(Iterator *)&i_1);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    puVar7 = Range<unsigned_long>::Iterator::operator*(&__end1_2);
    uVar1 = *puVar7;
    value_1.content.size_ = uVar1;
    sVar5 = ArrayPtr<const_kj::StringPtr>::size(&connectionHeaders);
    if (uVar1 < sVar5) {
      local_2d8 = ArrayPtr<const_kj::StringPtr>::operator[]
                            (&connectionHeaders,value_1.content.size_);
    }
    else {
      local_2d8 = Array<kj::StringPtr>::operator[](&this->indexedHeaders,value_1.content.size_);
    }
    auStack_198 = (undefined1  [8])(local_2d8->content).ptr;
    value_1.content.ptr = (char *)(local_2d8->content).size_;
    bVar3 = StringPtr::operator==((StringPtr *)auStack_198,(void *)0x0);
    target = __range1_2;
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      pHVar2 = this->table;
      HttpHeaderId::HttpHeaderId((HttpHeaderId *)&__range1_3,pHVar2,(uint)value_1.content.size_);
      id_00._12_4_ = 0;
      id_00.table = (HttpHeaderTable *)__range1_3;
      id_00.id = local_1b0;
      AVar10 = (ArrayPtr<const_char>)HttpHeaderTable::idToString(pHVar2,id_00);
      local_1a8 = AVar10;
      __range1_2 = (Range<unsigned_long> *)
                   kj::_::
                   fill<kj::StringPtr,kj::StringPtr_const&,kj::StringPtr&,kj::StringPtr_const&>
                             ((char *)target,(StringPtr *)&local_1a8,(StringPtr *)&size,
                              (StringPtr *)auStack_198,(StringPtr *)&colon.content.size_);
    }
    Range<unsigned_long>::Iterator::operator++(&__end1_2);
  }
  __end1_3 = Vector<kj::HttpHeaders::Header>::begin(&this->unindexedHeaders);
  pHVar8 = Vector<kj::HttpHeaders::Header>::end(&this->unindexedHeaders);
  for (; __end1_3 != pHVar8; __end1_3 = __end1_3 + 1) {
    _kjCondition_1._32_8_ = __end1_3;
    __range1_2 = (Range<unsigned_long> *)
                 kj::_::
                 fill<kj::StringPtr,kj::StringPtr_const&,kj::StringPtr_const&,kj::StringPtr_const&>
                           ((char *)__range1_2,&__end1_3->name,(StringPtr *)&size,&__end1_3->value,
                            (StringPtr *)&colon.content.size_);
  }
  __range1_2 = (Range<unsigned_long> *)
               kj::_::fill<kj::StringPtr>((char *)__range1_2,(StringPtr *)&colon.content.size_);
  local_208 = (char **)kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char **)&__range1_2)
  ;
  f_1.exception = (Exception *)String::end(__return_storage_ptr__);
  kj::_::DebugExpression<char*&>::operator==
            ((DebugComparison<char_*&,_char_*> *)local_200,(DebugExpression<char*&> *)&local_208,
             (char **)&f_1);
  bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_200);
  if (!bVar3) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char*>&>
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x45d,FAILED,"ptr == result.end()","_kjCondition,",
               (DebugComparison<char_*&,_char_*> *)local_200);
    kj::_::Debug::Fault::fatal(&local_218);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String HttpHeaders::serialize(kj::ArrayPtr<const char> word1,
                                  kj::ArrayPtr<const char> word2,
                                  kj::ArrayPtr<const char> word3,
                                  kj::ArrayPtr<const kj::StringPtr> connectionHeaders) const {
  const kj::StringPtr space = " ";
  const kj::StringPtr newline = "\r\n";
  const kj::StringPtr colon = ": ";

  size_t size = 2;  // final \r\n
  if (word1 != nullptr) {
    size += word1.size() + word2.size() + word3.size() + 4;
  }
  KJ_ASSERT(connectionHeaders.size() <= indexedHeaders.size());
  for (auto i: kj::indices(indexedHeaders)) {
    kj::StringPtr value = i < connectionHeaders.size() ? connectionHeaders[i] : indexedHeaders[i];
    if (value != nullptr) {
      size += table->idToString(HttpHeaderId(table, i)).size() + value.size() + 4;
    }
  }
  for (auto& header: unindexedHeaders) {
    size += header.name.size() + header.value.size() + 4;
  }

  String result = heapString(size);
  char* ptr = result.begin();

  if (word1 != nullptr) {
    ptr = kj::_::fill(ptr, word1, space, word2, space, word3, newline);
  }
  for (auto i: kj::indices(indexedHeaders)) {
    kj::StringPtr value = i < connectionHeaders.size() ? connectionHeaders[i] : indexedHeaders[i];
    if (value != nullptr) {
      ptr = kj::_::fill(ptr, table->idToString(HttpHeaderId(table, i)), colon, value, newline);
    }
  }
  for (auto& header: unindexedHeaders) {
    ptr = kj::_::fill(ptr, header.name, colon, header.value, newline);
  }
  ptr = kj::_::fill(ptr, newline);

  KJ_ASSERT(ptr == result.end());
  return result;
}